

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::readObject(Reader *this,Token *tokenStart)

{
  TokenType TVar1;
  bool bVar2;
  char *__s;
  _Elt_pointer ppVVar3;
  allocator<char> local_f1;
  Value numberName;
  string name;
  Token comma;
  Token colon;
  Token tokenName;
  Value init;
  
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  Value::Value(&init,objectValue);
  ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar3 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::swapPayload(ppVVar3[-1],&init);
  ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar3 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::setOffsetStart(ppVVar3[-1],(long)tokenStart->start_ - (long)this->begin_);
  do {
    readToken(this,&tokenName);
    while (TVar1 = tokenName.type_, tokenName.type_ == tokenComment) {
      readToken(this,&tokenName);
    }
    if (tokenName.type_ == tokenObjectEnd) {
      if (name._M_string_length != 0) {
        *name._M_dataplus._M_p = '\0';
LAB_003e643a:
        name._M_string_length = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&numberName,"Missing \'}\' or object member name",
                   (allocator<char> *)&colon);
        addErrorAndRecover(this,(string *)&numberName,&tokenName,tokenObjectEnd);
LAB_003e6468:
        std::__cxx11::string::~string((string *)&numberName);
LAB_003e6472:
        bVar2 = false;
        goto LAB_003e6478;
      }
      break;
    }
    name._M_string_length = 0;
    *name._M_dataplus._M_p = '\0';
    if (TVar1 == tokenNumber) {
      if ((this->features_).allowNumericKeys_ == true) {
        Value::Value(&numberName,nullValue);
        bVar2 = decodeNumber(this,&tokenName,&numberName);
        if (bVar2) {
          __s = Value::asCString(&numberName);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&colon,__s,(allocator<char> *)&comma);
          std::__cxx11::string::operator=((string *)&name,(string *)&colon);
          std::__cxx11::string::~string((string *)&colon);
        }
        else {
          recoverFromError(this,tokenObjectEnd);
        }
        Value::~Value(&numberName);
        if (bVar2) goto LAB_003e6371;
        goto LAB_003e6472;
      }
      goto LAB_003e643a;
    }
    if (TVar1 != tokenString) goto LAB_003e643a;
    bVar2 = decodeString(this,&tokenName,&name);
    if (!bVar2) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_003e6472;
    }
LAB_003e6371:
    readToken(this,&colon);
    if (colon.type_ != tokenMemberSeparator) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&numberName,"Missing \':\' after object member name",
                 (allocator<char> *)&comma);
      addErrorAndRecover(this,(string *)&numberName,&colon,tokenObjectEnd);
      goto LAB_003e6468;
    }
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar3 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    numberName.value_.map_ = (ObjectValues *)Value::operator[](ppVVar3[-1],&name);
    std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
              ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)&numberName);
    bVar2 = readValue(this);
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
    if (!bVar2) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_003e6472;
    }
    readToken(this,&comma);
    if ((tokenComment < comma.type_) || ((0x1404U >> (comma.type_ & 0x1f) & 1) == 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&numberName,"Missing \',\' or \'}\' in object declaration",&local_f1);
      addErrorAndRecover(this,(string *)&numberName,&comma,tokenObjectEnd);
      goto LAB_003e6468;
    }
    while (comma.type_ == tokenComment) {
      readToken(this,&comma);
    }
  } while (comma.type_ != tokenObjectEnd);
  bVar2 = true;
LAB_003e6478:
  Value::~Value(&init);
  std::__cxx11::string::~string((string *)&name);
  return bVar2;
}

Assistant:

bool Reader::readObject(Token& tokenStart) {
  Token tokenName;
  JSONCPP_STRING name;
  Value init(objectValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd && name.empty()) // empty object
      return true;
    name.clear();
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = JSONCPP_STRING(numberName.asCString());
    } else {
      break;
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover(
          "Missing ':' after object member name", colon, tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover(
          "Missing ',' or '}' in object declaration", comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover(
      "Missing '}' or object member name", tokenName, tokenObjectEnd);
}